

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawString::SetStringToTag(CommandDrawString *this,AActor *actor)

{
  MetaClass *pMVar1;
  char *copyStr;
  AActor *actor_local;
  CommandDrawString *this_local;
  
  if (actor == (AActor *)0x0) {
    this->cache = -1;
    FString::operator=(&this->str,"");
  }
  else {
    pMVar1 = AActor::GetClass(actor);
    if (pMVar1 != (MetaClass *)this->cache) {
      pMVar1 = AActor::GetClass(actor);
      this->cache = (intptr_t)pMVar1;
      copyStr = AActor::GetTag(actor,(char *)0x0);
      FString::operator=(&this->str,copyStr);
      RealignString(this);
    }
  }
  return;
}

Assistant:

void SetStringToTag(AActor *actor)
		{
			if (actor != NULL)
			{
				if ((intptr_t)actor->GetClass() != cache)
				{
					cache = (intptr_t)actor->GetClass();
					str = actor->GetTag();
					RealignString();
				}
			}
			else
			{
				cache = -1;
				str = "";
			}
		}